

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O3

FieldGenerator * __thiscall
google::protobuf::compiler::cpp::FieldGeneratorTable::get
          (FieldGeneratorTable *this,FieldDescriptor *field)

{
  Descriptor *pDVar1;
  FieldDescriptor **ppFVar2;
  
  pDVar1 = field->containing_type_;
  if (pDVar1 != this->descriptor_) {
    get();
LAB_00dd05f5:
    get();
  }
  if ((field->field_0x1 & 8) == 0) {
    if ((int)((long)field - (long)pDVar1->fields_ >> 3) * -0x45d1745d < 0) goto LAB_00dd05f5;
  }
  else {
    if ((field->scope_).extension_scope == (Descriptor *)0x0) {
      ppFVar2 = &field->file_->extensions_;
    }
    else {
      ppFVar2 = &((field->scope_).extension_scope)->extensions_;
    }
    if ((int)((long)field - (long)*ppFVar2 >> 3) * -0x45d1745d < 0) goto LAB_00dd05f5;
    if ((field->field_0x1 & 8) != 0) {
      if ((field->scope_).extension_scope == (Descriptor *)0x0) {
        ppFVar2 = &field->file_->extensions_;
      }
      else {
        ppFVar2 = &((field->scope_).extension_scope)->extensions_;
      }
      goto LAB_00dd05ac;
    }
  }
  ppFVar2 = &pDVar1->fields_;
LAB_00dd05ac:
  return (this->fields_).
         super__Vector_base<google::protobuf::compiler::cpp::FieldGenerator,_std::allocator<google::protobuf::compiler::cpp::FieldGenerator>_>
         ._M_impl.super__Vector_impl_data._M_start +
         (int)((ulong)((long)field - (long)*ppFVar2) >> 3) * -0x45d1745d;
}

Assistant:

const FieldGenerator& get(const FieldDescriptor* field) const {
    ABSL_CHECK_EQ(field->containing_type(), descriptor_);
    ABSL_DCHECK_GE(field->index(), 0);
    return fields_[static_cast<size_t>(field->index())];
  }